

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

_Bool possible_doorway(chunk_conflict *c,loc_conflict grid)

{
  _Bool _Var1;
  loc lVar2;
  int iVar3;
  long lVar4;
  
  _Var1 = square_in_bounds(c,(loc)grid);
  if (!_Var1) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/gen-cave.c"
                  ,0x325,"_Bool possible_doorway(struct chunk *, struct loc)");
  }
  _Var1 = square_in_bounds(c,(loc)grid);
  if (_Var1) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      lVar2 = (loc)loc_sum(grid,(loc_conflict)ddgrid_ddd[lVar4]);
      _Var1 = square_isfloor(c,lVar2);
      if (_Var1) {
        _Var1 = square_isroom(c,lVar2);
        iVar3 = iVar3 + (uint)!_Var1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (1 < iVar3) {
      lVar2 = next_grid((loc)grid,L'\b');
      _Var1 = square_isstrongwall(c,lVar2);
      if (_Var1) {
        lVar2 = next_grid((loc)grid,L'\x02');
        _Var1 = square_isstrongwall(c,lVar2);
        if (_Var1) {
          return true;
        }
      }
      lVar2 = next_grid((loc)grid,L'\x04');
      _Var1 = square_isstrongwall(c,lVar2);
      if (_Var1) {
        lVar2 = next_grid((loc)grid,L'\x06');
        _Var1 = square_isstrongwall(c,lVar2);
        if (_Var1) {
          return true;
        }
      }
    }
    return false;
  }
  __assert_fail("square_in_bounds(c, grid)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/gen-cave.c"
                ,0x30b,"int next_to_corr(struct chunk *, struct loc)");
}

Assistant:

static bool possible_doorway(struct chunk *c, struct loc grid)
{
	assert(square_in_bounds(c, grid));
	if (next_to_corr(c, grid) < 2)
		return false;
	else if (square_isstrongwall(c, next_grid(grid, DIR_N)) &&
			 square_isstrongwall(c, next_grid(grid, DIR_S)))
		return true;
	else if (square_isstrongwall(c, next_grid(grid, DIR_W)) &&
			 square_isstrongwall(c, next_grid(grid, DIR_E)))
		return true;
	else
		return false;
}